

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.cpp
# Opt level: O0

void mir::inst::display_op(ostream *o,OpAcc val)

{
  int in_ESI;
  ostream *in_RDI;
  
  if (in_ESI == 0) {
    std::operator<<(in_RDI,"MulAdd");
  }
  else if (in_ESI == 1) {
    std::operator<<(in_RDI,"MulShAdd");
  }
  return;
}

Assistant:

void display_op(std::ostream& o, OpAcc val) {
  switch (val) {
    case OpAcc::MulAdd:
      o << "MulAdd";
      break;
    case OpAcc::MulShAdd:
      o << "MulShAdd";
      break;
  }
}